

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImGui::TabItemLabelAndCloseButton
               (ImDrawList *draw_list,ImRect *bb,ImGuiTabItemFlags flags,ImVec2 frame_padding,
               char *label,ImGuiID tab_id,ImGuiID close_button_id,bool is_contents_visible,
               bool *out_just_closed,bool *out_text_clipped)

{
  ImVec2 IVar1;
  bool bVar2;
  float fVar3;
  float local_f0;
  float ellipsis_max_x;
  float local_c8;
  undefined1 local_c4 [4];
  float close_button_sz;
  ImGuiLastItemDataBackup last_item_backup;
  bool close_button_visible;
  float fStack_94;
  bool close_button_pressed;
  ImRect text_ellipsis_clip_bb;
  ImVec2 local_80;
  ImVec2 local_78;
  ImVec2 unsaved_marker_pos;
  undefined1 local_68 [8];
  ImRect text_pixel_clip_bb;
  char *TAB_UNSAVED_MARKER;
  ImVec2 label_size;
  ImGuiContext *g;
  bool is_contents_visible_local;
  ImGuiID close_button_id_local;
  ImGuiID tab_id_local;
  char *label_local;
  ImGuiTabItemFlags flags_local;
  ImRect *bb_local;
  ImDrawList *draw_list_local;
  ImVec2 frame_padding_local;
  
  label_size = (ImVec2)GImGui;
  draw_list_local = (ImDrawList *)frame_padding;
  TAB_UNSAVED_MARKER = (char *)CalcTextSize(label,(char *)0x0,true,-1.0);
  if (out_just_closed != (bool *)0x0) {
    *out_just_closed = false;
  }
  if (out_text_clipped != (bool *)0x0) {
    *out_text_clipped = false;
  }
  fVar3 = ImRect::GetWidth(bb);
  if (1.0 < fVar3) {
    text_pixel_clip_bb.Max = (ImVec2)((long)" *Inactive*" + 10);
    ImRect::ImRect((ImRect *)local_68,(bb->Min).x + draw_list_local._0_4_,
                   (bb->Min).y + draw_list_local._4_4_,(bb->Max).x - draw_list_local._0_4_,
                   (bb->Max).y);
    if ((flags & 1U) != 0) {
      unsaved_marker_pos = CalcTextSize((char *)text_pixel_clip_bb.Max,(char *)0x0,false,-1.0);
      text_pixel_clip_bb.Min.x = text_pixel_clip_bb.Min.x - unsaved_marker_pos.x;
      fVar3 = ImMin<float>((bb->Min).x + draw_list_local._0_4_ + TAB_UNSAVED_MARKER._0_4_ + 2.0,
                           text_pixel_clip_bb.Min.x);
      ImVec2::ImVec2(&local_78,fVar3,
                     (bb->Min).y + draw_list_local._4_4_ +
                     (float)(int)(*(float *)((long)label_size + 0x1980) * -0.25));
      local_80 = operator-(&bb->Max,(ImVec2 *)&draw_list_local);
      IVar1 = text_pixel_clip_bb.Max;
      ImVec2::ImVec2(&text_ellipsis_clip_bb.Max,0.0,0.0);
      RenderTextClippedEx(draw_list,&local_78,&local_80,(char *)IVar1,(char *)0x0,(ImVec2 *)0x0,
                          &text_ellipsis_clip_bb.Max,(ImRect *)0x0);
    }
    last_item_backup.LastItemDisplayRect.Max.y = (float)local_68._0_4_;
    fStack_94 = (float)local_68._4_4_;
    IVar1 = stack0xffffffffffffff68;
    text_ellipsis_clip_bb.Min.y = text_pixel_clip_bb.Min.y;
    text_ellipsis_clip_bb.Min.x = text_pixel_clip_bb.Min.x;
    if (out_text_clipped != (bool *)0x0) {
      last_item_backup.LastItemDisplayRect.Max.y = local_68._0_4_;
      *out_text_clipped =
           text_pixel_clip_bb.Min.x <
           last_item_backup.LastItemDisplayRect.Max.y + TAB_UNSAVED_MARKER._0_4_;
    }
    last_item_backup.LastItemDisplayRect.Max.x._3_1_ = 0;
    last_item_backup.LastItemDisplayRect.Max.x._2_1_ = 0;
    unique0x10000514 = IVar1;
    if (((close_button_id != 0) &&
        ((is_contents_visible ||
         (fVar3 = ImRect::GetWidth(bb), *(float *)((long)label_size + 0x15ec) <= fVar3)))) &&
       ((*(ImGuiID *)((long)label_size + 0x1b1c) == tab_id ||
        (((*(ImGuiID *)((long)label_size + 0x1b1c) == close_button_id ||
          (*(ImGuiID *)((long)label_size + 0x1b30) == tab_id)) ||
         (*(ImGuiID *)((long)label_size + 0x1b30) == close_button_id)))))) {
      last_item_backup.LastItemDisplayRect.Max.x._2_1_ = 1;
    }
    if ((last_item_backup.LastItemDisplayRect.Max.x._2_1_ & 1) != 0) {
      ImGuiLastItemDataBackup::ImGuiLastItemDataBackup((ImGuiLastItemDataBackup *)local_c4);
      local_c8 = *(float *)((long)label_size + 0x1980);
      PushStyleVar(10,(ImVec2 *)&draw_list_local);
      ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff30,
                     (-draw_list_local._0_4_ + -draw_list_local._0_4_ + (bb->Max).x) - local_c8,
                     (bb->Min).y);
      bVar2 = CloseButton(close_button_id,(ImVec2 *)&stack0xffffffffffffff30);
      if (bVar2) {
        last_item_backup.LastItemDisplayRect.Max.x._3_1_ = 1;
      }
      PopStyleVar(1);
      ImGuiLastItemDataBackup::Restore((ImGuiLastItemDataBackup *)local_c4);
      if (((flags & 4U) == 0) && (bVar2 = IsMouseClicked(2,false), bVar2)) {
        last_item_backup.LastItemDisplayRect.Max.x._3_1_ = 1;
      }
      text_pixel_clip_bb.Min.x = text_pixel_clip_bb.Min.x - local_c8;
    }
    if ((last_item_backup.LastItemDisplayRect.Max.x._2_1_ & 1) == 0) {
      local_f0 = (bb->Max).x - 1.0;
    }
    else {
      local_f0 = text_pixel_clip_bb.Min.x;
    }
    RenderTextEllipsis(draw_list,(ImVec2 *)&last_item_backup.LastItemDisplayRect.Max.y,
                       &text_ellipsis_clip_bb.Min,text_pixel_clip_bb.Min.x,local_f0,label,
                       (char *)0x0,(ImVec2 *)&TAB_UNSAVED_MARKER);
    if (out_just_closed != (bool *)0x0) {
      *out_just_closed = (bool)(last_item_backup.LastItemDisplayRect.Max.x._3_1_ & 1);
    }
  }
  return;
}

Assistant:

void ImGui::TabItemLabelAndCloseButton(ImDrawList* draw_list, const ImRect& bb, ImGuiTabItemFlags flags, ImVec2 frame_padding, const char* label, ImGuiID tab_id, ImGuiID close_button_id, bool is_contents_visible, bool* out_just_closed, bool* out_text_clipped)
{
    ImGuiContext& g = *GImGui;
    ImVec2 label_size = CalcTextSize(label, NULL, true);

    if (out_just_closed)
        *out_just_closed = false;
    if (out_text_clipped)
        *out_text_clipped = false;

    if (bb.GetWidth() <= 1.0f)
        return;

    // In Style V2 we'll have full override of all colors per state (e.g. focused, selected)
    // But right now if you want to alter text color of tabs this is what you need to do.
#if 0
    const float backup_alpha = g.Style.Alpha;
    if (!is_contents_visible)
        g.Style.Alpha *= 0.7f;
#endif

    // Render text label (with clipping + alpha gradient) + unsaved marker
    const char* TAB_UNSAVED_MARKER = "*";
    ImRect text_pixel_clip_bb(bb.Min.x + frame_padding.x, bb.Min.y + frame_padding.y, bb.Max.x - frame_padding.x, bb.Max.y);
    if (flags & ImGuiTabItemFlags_UnsavedDocument)
    {
        text_pixel_clip_bb.Max.x -= CalcTextSize(TAB_UNSAVED_MARKER, NULL, false).x;
        ImVec2 unsaved_marker_pos(ImMin(bb.Min.x + frame_padding.x + label_size.x + 2, text_pixel_clip_bb.Max.x), bb.Min.y + frame_padding.y + IM_FLOOR(-g.FontSize * 0.25f));
        RenderTextClippedEx(draw_list, unsaved_marker_pos, bb.Max - frame_padding, TAB_UNSAVED_MARKER, NULL, NULL);
    }
    ImRect text_ellipsis_clip_bb = text_pixel_clip_bb;

    // Return clipped state ignoring the close button
    if (out_text_clipped)
    {
        *out_text_clipped = (text_ellipsis_clip_bb.Min.x + label_size.x) > text_pixel_clip_bb.Max.x;
        //draw_list->AddCircle(text_ellipsis_clip_bb.Min, 3.0f, *out_text_clipped ? IM_COL32(255, 0, 0, 255) : IM_COL32(0, 255, 0, 255));
    }

    // Close Button
    // We are relying on a subtle and confusing distinction between 'hovered' and 'g.HoveredId' which happens because we are using ImGuiButtonFlags_AllowOverlapMode + SetItemAllowOverlap()
    //  'hovered' will be true when hovering the Tab but NOT when hovering the close button
    //  'g.HoveredId==id' will be true when hovering the Tab including when hovering the close button
    //  'g.ActiveId==close_button_id' will be true when we are holding on the close button, in which case both hovered booleans are false
    bool close_button_pressed = false;
    bool close_button_visible = false;
    if (close_button_id != 0)
        if (is_contents_visible || bb.GetWidth() >= g.Style.TabMinWidthForCloseButton)
            if (g.HoveredId == tab_id || g.HoveredId == close_button_id || g.ActiveId == tab_id || g.ActiveId == close_button_id)
                close_button_visible = true;
    if (close_button_visible)
    {
        ImGuiLastItemDataBackup last_item_backup;
        const float close_button_sz = g.FontSize;
        PushStyleVar(ImGuiStyleVar_FramePadding, frame_padding);
        if (CloseButton(close_button_id, ImVec2(bb.Max.x - frame_padding.x * 2.0f - close_button_sz, bb.Min.y)))
            close_button_pressed = true;
        PopStyleVar();
        last_item_backup.Restore();

        // Close with middle mouse button
        if (!(flags & ImGuiTabItemFlags_NoCloseWithMiddleMouseButton) && IsMouseClicked(2))
            close_button_pressed = true;

        text_pixel_clip_bb.Max.x -= close_button_sz;
    }

    // FIXME: if FramePadding is noticeably large, ellipsis_max_x will be wrong here (e.g. #3497), maybe for consistency that parameter of RenderTextEllipsis() shouldn't exist..
    float ellipsis_max_x = close_button_visible ? text_pixel_clip_bb.Max.x : bb.Max.x - 1.0f;
    RenderTextEllipsis(draw_list, text_ellipsis_clip_bb.Min, text_ellipsis_clip_bb.Max, text_pixel_clip_bb.Max.x, ellipsis_max_x, label, NULL, &label_size);

#if 0
    if (!is_contents_visible)
        g.Style.Alpha = backup_alpha;
#endif

    if (out_just_closed)
        *out_just_closed = close_button_pressed;
}